

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixxx.cc
# Opt level: O0

void __thiscall ixxx::ansi::env::test_method(env *this)

{
  undefined8 uVar1;
  bool bVar2;
  char *__s;
  lazy_ostream *prev;
  undefined1 local_a2;
  undefined1 local_a1;
  basic_cstring<const_char> local_a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_90;
  basic_cstring<const_char> local_68;
  basic_cstring<const_char> local_58 [2];
  allocator<char> local_31;
  string local_30 [8];
  string s;
  env *this_local;
  
  s.field_2._8_8_ = this;
  __s = getenv("PATH");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,__s,&local_31);
  std::allocator<char>::~allocator(&local_31);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_68);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_58,0x71,&local_68);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_90,prev,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc"
               ,0x5a);
    local_a1 = std::__cxx11::string::empty();
    local_a2 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_90,&local_a0,0x71,1,2,&local_a1,"s.empty()",&local_a2,"false");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_90);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( env )
    {
      string s(ansi::getenv("PATH"));
      BOOST_CHECK_EQUAL(s.empty(), false);
    }